

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O2

shared_ptr<chaiscript::dispatch::Proxy_Function_Base>
chaiscript::bootstrap::shared_ptr_unconst_clone<chaiscript::dispatch::Proxy_Function_Base>
          (shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *p)

{
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> sVar1;
  
  sVar1 = std::
          const_pointer_cast<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Base_const>
                    (p);
  sVar1.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)p;
  return (shared_ptr<chaiscript::dispatch::Proxy_Function_Base>)
         sVar1.
         super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::remove_const_t<Type>> shared_ptr_unconst_clone(const std::shared_ptr<std::add_const_t<Type>> &p) {
    return std::const_pointer_cast<typename std::remove_const<Type>::type>(p);
  }